

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O1

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>::update_paging
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false> *this)

{
  uint8_t *puVar1;
  ulong uVar2;
  int segment;
  ulong uVar3;
  PrimarySlot *this_00;
  bool bVar4;
  
  uVar2 = (ulong)this->primary_slots_;
  this->final_slot_ = this->memory_slots_ + (this->primary_slots_ >> 6);
  uVar3 = 0;
  do {
    this_00 = &this->memory_slots_[(byte)uVar2 & 3].super_PrimarySlot;
    uVar2 = uVar2 >> 2;
    segment = (int)uVar3;
    puVar1 = PrimarySlot::read_pointer(this_00,segment);
    this->read_pointers_[uVar3] = puVar1;
    puVar1 = PrimarySlot::write_pointer(this_00,segment);
    this->write_pointers_[uVar3] = puVar1;
    puVar1 = PrimarySlot::read_pointer(this_00,segment + 1);
    this->read_pointers_[uVar3 + 1] = puVar1;
    puVar1 = PrimarySlot::write_pointer(this_00,segment + 1);
    this->write_pointers_[uVar3 + 1] = puVar1;
    bVar4 = uVar3 < 6;
    uVar3 = uVar3 + 2;
  } while (bVar4);
  set_use_fast_tape(this);
  return;
}

Assistant:

void update_paging() {
			uint8_t primary = primary_slots_;

			// Update final slot; this direct pointer will be used for
			// secondary slot communication.
			final_slot_ = &memory_slots_[primary >> 6];

			for(int c = 0; c < 8; c += 2) {
				const HandledSlot &slot = memory_slots_[primary & 3];
				primary >>= 2;

				read_pointers_[c] = slot.read_pointer(c);
				write_pointers_[c] = slot.write_pointer(c);
				read_pointers_[c+1] = slot.read_pointer(c+1);
				write_pointers_[c+1] = slot.write_pointer(c+1);
			}
			set_use_fast_tape();
		}